

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O3

boolean tele_jump_ok(level *lev,int x1,int y1,int x2,int y2)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  cVar1 = (lev->dndest).nlx;
  iVar4 = (int)cVar1;
  if (cVar1 < '\x01') {
LAB_0025cba5:
    cVar1 = (lev->updest).nlx;
    iVar4 = (int)cVar1;
    if ('\0' < cVar1) {
      if ((x1 < iVar4) || (iVar3 = (int)(lev->updest).nhx, iVar3 < x1)) {
LAB_0025cc0e:
        if (x2 < iVar4) goto LAB_0025cc4a;
        iVar3 = (int)(lev->updest).nhx;
      }
      else {
        iVar5 = (int)(lev->updest).nly;
        if ((iVar5 <= y1) &&
           ((iVar6 = (int)(lev->updest).nhy, y1 <= iVar6 &&
            ((iVar6 < y2 || iVar3 < x2) || (y2 < iVar5 || x2 < iVar4))))) goto LAB_0025cc36;
        if (y1 < (lev->updest).nly) goto LAB_0025cc0e;
        if ((x2 < iVar4) || (y1 <= (lev->updest).nhy)) goto LAB_0025cc4a;
      }
      if ((x2 <= iVar3) && (((lev->updest).nly <= y2 && (y2 <= (lev->updest).nhy))))
      goto LAB_0025cc36;
    }
LAB_0025cc4a:
    bVar2 = '\x01';
  }
  else {
    if ((x1 < iVar4) || (iVar3 = (int)(lev->dndest).nhx, iVar3 < x1)) {
LAB_0025cb66:
      if (iVar4 <= x2) {
        iVar3 = (int)(lev->dndest).nhx;
LAB_0025cb72:
        if ((x2 <= iVar3) && (((lev->dndest).nly <= y2 && (y2 <= (lev->dndest).nhy))))
        goto LAB_0025cc36;
      }
      goto LAB_0025cba5;
    }
    iVar5 = (int)(lev->dndest).nly;
    if ((y1 < iVar5) ||
       ((iVar6 = (int)(lev->dndest).nhy, iVar6 < y1 ||
        ((y2 <= iVar6 && x2 <= iVar3) && (iVar5 <= y2 && iVar4 <= x2))))) {
      if (y1 < (lev->dndest).nly) goto LAB_0025cb66;
      if ((x2 < iVar4) || (y1 <= (lev->dndest).nhy)) goto LAB_0025cba5;
      goto LAB_0025cb72;
    }
LAB_0025cc36:
    bVar2 = '\0';
  }
  return bVar2;
}

Assistant:

static boolean tele_jump_ok(const struct level *lev, int x1, int y1, int x2, int y2)
{
	if (lev->dndest.nlx > 0) {
	    /* if inside a restricted region, can't teleport outside */
	    if (within_bounded_area(x1, y1, lev->dndest.nlx, lev->dndest.nly,
						lev->dndest.nhx, lev->dndest.nhy) &&
		!within_bounded_area(x2, y2, lev->dndest.nlx, lev->dndest.nly,
						lev->dndest.nhx, lev->dndest.nhy))
		return FALSE;
	    /* and if outside, can't teleport inside */
	    if (!within_bounded_area(x1, y1, lev->dndest.nlx, lev->dndest.nly,
						lev->dndest.nhx, lev->dndest.nhy) &&
		within_bounded_area(x2, y2, lev->dndest.nlx, lev->dndest.nly,
						lev->dndest.nhx, lev->dndest.nhy))
		return FALSE;
	}
	if (lev->updest.nlx > 0) {		/* ditto */
	    if (within_bounded_area(x1, y1, lev->updest.nlx, lev->updest.nly,
						lev->updest.nhx, lev->updest.nhy) &&
		!within_bounded_area(x2, y2, lev->updest.nlx, lev->updest.nly,
						lev->updest.nhx, lev->updest.nhy))
		return FALSE;
	    if (!within_bounded_area(x1, y1, lev->updest.nlx, lev->updest.nly,
						lev->updest.nhx, lev->updest.nhy) &&
		within_bounded_area(x2, y2, lev->updest.nlx, lev->updest.nly,
						lev->updest.nhx, lev->updest.nhy))
		return FALSE;
	}
	return TRUE;
}